

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-syscalls.c
# Opt level: O0

int uv__sendmmsg(int fd,uv__mmsghdr *mmsg,uint vlen)

{
  long lVar1;
  uint vlen_local;
  uv__mmsghdr *mmsg_local;
  int fd_local;
  
  lVar1 = syscall(0x133,(ulong)(uint)fd,mmsg,(ulong)vlen,0);
  return (int)lVar1;
}

Assistant:

int uv__sendmmsg(int fd, struct uv__mmsghdr* mmsg, unsigned int vlen) {
#if defined(__i386__)
  unsigned long args[4];
  int rc;

  args[0] = (unsigned long) fd;
  args[1] = (unsigned long) mmsg;
  args[2] = (unsigned long) vlen;
  args[3] = /* flags */ 0;

  /* socketcall() raises EINVAL when SYS_SENDMMSG is not supported. */
  rc = syscall(/* __NR_socketcall */ 102, 20 /* SYS_SENDMMSG */, args);
  if (rc == -1)
    if (errno == EINVAL)
      errno = ENOSYS;

  return rc;
#elif defined(__NR_sendmmsg)
  return syscall(__NR_sendmmsg, fd, mmsg, vlen, /* flags */ 0);
#else
  return errno = ENOSYS, -1;
#endif
}